

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

CodeLocation __thiscall
soul::SimpleTokeniser::findEndOfMatchingDelimiter
          (SimpleTokeniser *this,CodeLocation *start,TokenType openDelim,TokenType closeDelim)

{
  bool bVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  SimpleTokeniser tokeniser;
  
  SimpleTokeniser(&tokeniser,start,true);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&tokeniser.super_SOULTokeniser,openDelim);
  if (bVar1) {
    bVar1 = skipPastMatchingCloseDelimiter(&tokeniser,openDelim,closeDelim);
    if (bVar1) {
      (this->super_SOULTokeniser)._vptr_Tokeniser =
           (_func_int **)tokeniser.super_SOULTokeniser.location.sourceCode.object;
      if (tokeniser.super_SOULTokeniser.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((tokeniser.super_SOULTokeniser.location.sourceCode.object)->super_RefCountedObject).
        refCount = ((tokeniser.super_SOULTokeniser.location.sourceCode.object)->
                   super_RefCountedObject).refCount + 1;
      }
      (this->super_SOULTokeniser).startLocation.sourceCode.object =
           (SourceCodeText *)tokeniser.super_SOULTokeniser.location.location.data;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokeniser.super_SOULTokeniser);
      UVar2.data = extraout_RDX;
    }
    else {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&tokeniser.super_SOULTokeniser);
      (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
      (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
      UVar2.data = extraout_RDX_00;
    }
    CVar3.location.data = UVar2.data;
    CVar3.sourceCode.object = (SourceCodeText *)this;
    return CVar3;
  }
  throwInternalCompilerError("tokeniser.matches (openDelim)","findEndOfMatchingDelimiter",0x54);
}

Assistant:

static CodeLocation findEndOfMatchingDelimiter (const CodeLocation& start, TokenType openDelim, TokenType closeDelim)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);
            SOUL_ASSERT (tokeniser.matches (openDelim));

            if (tokeniser.skipPastMatchingCloseDelimiter (openDelim, closeDelim))
                return tokeniser.location;
        }
        catch (const AbortCompilationException&) {}

        return {};
    }